

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O3

int parse_integer(char *buffer,int num_digits,int use_leading_spaces,int *value)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  
  if (num_digits < 2 || use_leading_spaces == 0) {
    *value = 0;
    if (num_digits < 1) {
      return 0;
    }
  }
  else {
    pcVar3 = buffer + ((ulong)(uint)num_digits - 1);
    do {
      if (*buffer != ' ') goto LAB_001329e0;
      buffer = buffer + 1;
      bVar1 = 2 < num_digits;
      num_digits = num_digits + -1;
    } while (bVar1);
    num_digits = 1;
    buffer = pcVar3;
LAB_001329e0:
    *value = 0;
  }
  iVar4 = num_digits + 1;
  iVar2 = 0;
  do {
    if ((byte)(*buffer - 0x3aU) < 0xf6) {
      return -1;
    }
    iVar2 = (uint)(byte)(*buffer - 0x30) + iVar2 * 10;
    *value = iVar2;
    buffer = buffer + 1;
    iVar4 = iVar4 + -1;
  } while (1 < iVar4);
  return 0;
}

Assistant:

static int parse_integer(const char *buffer, int num_digits, int use_leading_spaces, int *value)
{
    if (use_leading_spaces)
    {
        while (num_digits > 1 && *buffer == ' ')
        {
            buffer++;
            num_digits--;
        }
    }
    *value = 0;
    while (num_digits > 0)
    {
        if (*buffer < '0' || *buffer > '9')
        {
            return -1;
        }
        *value = (*value) * 10 + (*buffer - '0');
        buffer++;
        num_digits--;
    }

    return 0;
}